

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

ostream * util::math::internal_vector::operator<<(ostream *out,D *v)

{
  ostream *poVar1;
  int i;
  int b;
  char *pcVar2;
  double dVar3;
  
  std::operator<<(out,"[");
  pcVar2 = "";
  for (b = 0; b != 2; b = b + 1) {
    std::operator<<(out,pcVar2);
    dVar3 = BasicVector<Vector2,_double,_2UL>::operator[]((BasicVector<Vector2,_double,_2UL> *)v,b);
    std::ostream::_M_insert<double>(dVar3);
    pcVar2 = ", ";
  }
  poVar1 = std::operator<<(out,"]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const D& v) {
    out << "[";
    const char *sep = "";
    for (int i = 0; i < SIZE; ++i) {
      out << sep;
      Print(out, v[i]);
      sep = ", ";
    }
    return out << "]";
  }